

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_erasure.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200 [55];
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Drawable,_Square,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  local_1c9;
  undefined1 local_1c8 [8];
  App example;
  stringstream str;
  ostream local_188 [380];
  int local_c;
  
  local_c = 0;
  std::__cxx11::stringstream::stringstream((stringstream *)&example.drawable.draw._M_invoker);
  anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)&config);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_Drawable,_Square,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<App,_0>((App *)local_1c8,&local_1c9);
  App::draw((App *)local_1c8,local_188);
  std::__cxx11::stringstream::str();
  bVar1 = std::operator==("Square",local_200);
  if (!bVar1) {
    __assert_fail("\"Square\" == str.str()",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/polymorphism/type_erasure.cpp"
                  ,0x2f,"int main()");
  }
  std::__cxx11::string::~string((string *)local_200);
  App::~App((App *)local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&example.drawable.draw._M_invoker);
  return local_c;
}

Assistant:

int main() {
  std::stringstream str{};
  auto example = config().create<App>();
  example.draw(str);
  assert("Square" == str.str());
}